

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

bool __thiscall CConnman::AddedNodesContain(CConnman *this,CAddress *addr)

{
  long lVar1;
  AddedNodeParams *pAVar2;
  bool bVar3;
  __normal_iterator<const_AddedNodeParams_*,_std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>_>
  __it;
  __normal_iterator<const_AddedNodeParams_*,_std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>_>
  _Var4;
  long lVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  string *local_98;
  string *local_90;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock88;
  string addr_port_str;
  string addr_str;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CNetAddr::ToStringAddr_abi_cxx11_(&addr_str,(CNetAddr *)addr);
  CService::ToStringAddrPort_abi_cxx11_(&addr_port_str,&addr->super_CService);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock88,&this->m_added_nodes_mutex,"m_added_nodes_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp",
             0xde1,false);
  __it._M_current =
       (this->m_added_node_params).
       super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
       super__Vector_impl_data._M_start;
  pAVar2 = (this->m_added_node_params).
           super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar5 = (long)pAVar2 - (long)__it._M_current;
  if (0x17 < (ulong)(lVar5 / 0x28)) {
    bVar3 = false;
    goto LAB_0017fb89;
  }
  local_98 = &addr_str;
  local_90 = &addr_port_str;
  for (uVar6 = (ulong)(lVar5 / 0x28) >> 2; 0 < (long)uVar6; uVar6 = uVar6 - 1) {
    bVar3 = __gnu_cxx::__ops::_Iter_pred<CConnman::AddedNodesContain(CAddress_const&)const::$_0>::
            operator()((_Iter_pred<CConnman::AddedNodesContain(CAddress_const&)const::__0> *)
                       &local_98,__it);
    _Var4._M_current = __it._M_current;
    if (bVar3) goto LAB_0017fb83;
    bVar3 = __gnu_cxx::__ops::_Iter_pred<CConnman::AddedNodesContain(CAddress_const&)const::$_0>::
            operator()((_Iter_pred<CConnman::AddedNodesContain(CAddress_const&)const::__0> *)
                       &local_98,__it._M_current + 1);
    _Var4._M_current = __it._M_current + 1;
    if (bVar3) goto LAB_0017fb83;
    bVar3 = __gnu_cxx::__ops::_Iter_pred<CConnman::AddedNodesContain(CAddress_const&)const::$_0>::
            operator()((_Iter_pred<CConnman::AddedNodesContain(CAddress_const&)const::__0> *)
                       &local_98,__it._M_current + 2);
    _Var4._M_current = __it._M_current + 2;
    if (bVar3) goto LAB_0017fb83;
    bVar3 = __gnu_cxx::__ops::_Iter_pred<CConnman::AddedNodesContain(CAddress_const&)const::$_0>::
            operator()((_Iter_pred<CConnman::AddedNodesContain(CAddress_const&)const::__0> *)
                       &local_98,__it._M_current + 3);
    _Var4._M_current = __it._M_current + 3;
    if (bVar3) goto LAB_0017fb83;
    __it._M_current = __it._M_current + 4;
    lVar5 = lVar5 + -0xa0;
  }
  lVar5 = lVar5 / 0x28;
  if (lVar5 == 1) {
LAB_0017fb63:
    bVar3 = __gnu_cxx::__ops::_Iter_pred<CConnman::AddedNodesContain(CAddress_const&)const::$_0>::
            operator()((_Iter_pred<CConnman::AddedNodesContain(CAddress_const&)const::__0> *)
                       &local_98,__it);
    _Var4._M_current = __it._M_current;
    if (!bVar3) {
      _Var4._M_current = pAVar2;
    }
  }
  else if (lVar5 == 2) {
LAB_0017fb4e:
    bVar3 = __gnu_cxx::__ops::_Iter_pred<CConnman::AddedNodesContain(CAddress_const&)const::$_0>::
            operator()((_Iter_pred<CConnman::AddedNodesContain(CAddress_const&)const::__0> *)
                       &local_98,__it);
    _Var4._M_current = __it._M_current;
    if (!bVar3) {
      __it._M_current = __it._M_current + 1;
      goto LAB_0017fb63;
    }
  }
  else {
    _Var4._M_current = pAVar2;
    if ((lVar5 == 3) &&
       (bVar3 = __gnu_cxx::__ops::_Iter_pred<CConnman::AddedNodesContain(CAddress_const&)const::$_0>
                ::operator()((_Iter_pred<CConnman::AddedNodesContain(CAddress_const&)const::__0> *)
                             &local_98,__it), _Var4._M_current = __it._M_current, !bVar3)) {
      __it._M_current = __it._M_current + 1;
      goto LAB_0017fb4e;
    }
  }
LAB_0017fb83:
  bVar3 = _Var4._M_current != pAVar2;
LAB_0017fb89:
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock88.super_unique_lock);
  std::__cxx11::string::~string((string *)&addr_port_str);
  std::__cxx11::string::~string((string *)&addr_str);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool CConnman::AddedNodesContain(const CAddress& addr) const
{
    AssertLockNotHeld(m_added_nodes_mutex);
    const std::string addr_str{addr.ToStringAddr()};
    const std::string addr_port_str{addr.ToStringAddrPort()};
    LOCK(m_added_nodes_mutex);
    return (m_added_node_params.size() < 24 // bound the query to a reasonable limit
            && std::any_of(m_added_node_params.cbegin(), m_added_node_params.cend(),
                           [&](const auto& p) { return p.m_added_node == addr_str || p.m_added_node == addr_port_str; }));
}